

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall gl4cts::DirectStateAccess::Textures::CopyErrorsTest::Test1D(CopyErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  deUint32 dVar10;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  bool is_ok;
  Functions *gl;
  CopyErrorsTest *this_local;
  long lVar12;
  
  pRVar11 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar9 = (*pRVar11->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar9);
  (**(code **)(lVar12 + 0x78))(0x8d40,this->m_fbo_incomplete);
  dVar10 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar10,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2a8b);
  (**(code **)(lVar12 + 0x388))(this->m_to_1D_dst,0,0,0,0,4);
  bVar1 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x506,
                     "glCopyTextureSubImage1D",
                     "the object bound to READ_FRAMEBUFFER_BINDING is not framebuffer complete.");
  (**(code **)(lVar12 + 0x78))(0x8d40,this->m_fbo);
  dVar10 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar10,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2a98);
  (**(code **)(lVar12 + 0x1218))(0x8ce0);
  dVar10 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar10,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2a9b);
  (**(code **)(lVar12 + 0x388))(this->m_to_invalid,0,0,0,0,4);
  bVar2 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                     "glCopyTextureSubImage1D",
                     "texture is not the name of an existing texture object.");
  (**(code **)(lVar12 + 0x388))(this->m_to_2D_dst,0,0,0,0,4);
  bVar3 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                     "glCopyTextureSubImage1D","the effective target of texture is not TEXTURE_1D.")
  ;
  (**(code **)(lVar12 + 0x388))(this->m_to_1D_dst,0xffffffff,0,0,0,4);
  bVar4 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                     "glCopyTextureSubImage1D","level is less than 0.");
  (**(code **)(lVar12 + 0x388))(this->m_to_1D_dst,0,0xffffffff,0,0,4);
  bVar5 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                     "glCopyTextureSubImage1D","xoffset<0.");
  (**(code **)(lVar12 + 0x388))(this->m_to_1D_dst,0,1,0,0,4);
  bVar6 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x501,
                     "glCopyTextureSubImage1D",
                     "(xoffset+width)>w, where w is the TEXTURE_WIDTH of the texture image being modified."
                    );
  (**(code **)(lVar12 + 0x1218))(0);
  dVar10 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar10,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2ac0);
  (**(code **)(lVar12 + 0x388))(this->m_to_1D_dst,0,0,0,0,4);
  bVar7 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                     "glCopyTextureSubImage1D","the read buffer is NONE.");
  (**(code **)(lVar12 + 0x78))(0x8d40,this->m_fbo_ms);
  dVar10 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar10,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2aca);
  (**(code **)(lVar12 + 0x1218))(0x8ce0);
  dVar10 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar10,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2acd);
  (**(code **)(lVar12 + 0x388))(this->m_to_1D_dst,0,0,0,0,4);
  bVar8 = ErrorsUtilities::CheckErrorAndLog
                    ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                     "glCopyTextureSubImage1D",
                     "the effective value of SAMPLE_BUFFERS for the read framebuffer is one.");
  return ((((((bVar1 && bVar2) && bVar3) && bVar4) && bVar5) && bVar6) && bVar7) && bVar8;
}

Assistant:

bool CopyErrorsTest::Test1D()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	/* Bind framebuffer. */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_incomplete);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	/* Check that INVALID_FRAMEBUFFER_OPERATION is generated by
	 CopyTextureSubImage1D if the object bound to READ_FRAMEBUFFER_BINDING is
	 not framebuffer complete. */
	{
		gl.copyTextureSubImage1D(m_to_1D_dst, 0, 0, 0, 0, s_width);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_FRAMEBUFFER_OPERATION, "glCopyTextureSubImage1D",
								  "the object bound to READ_FRAMEBUFFER_BINDING is not framebuffer complete.");
	}

	/* Bind framebuffer. */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.readBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	/* Check that INVALID_OPERATION is generated by CopyTextureSubImage1D if
	 texture is not the name of an existing texture object, or if the
	 effective target of texture is not TEXTURE_1D. */
	{
		gl.copyTextureSubImage1D(m_to_invalid, 0, 0, 0, 0, s_width);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCopyTextureSubImage1D",
								  "texture is not the name of an existing texture object.");

		gl.copyTextureSubImage1D(m_to_2D_dst, 0, 0, 0, 0, s_width);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCopyTextureSubImage1D",
								  "the effective target of texture is not TEXTURE_1D.");
	}

	/* Check that INVALID_VALUE is generated by CopyTextureSubImage1D if level is less than 0. */
	{
		gl.copyTextureSubImage1D(m_to_1D_dst, -1, 0, 0, 0, s_width);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCopyTextureSubImage1D", "level is less than 0.");
	}

	/* Check that INVALID_VALUE is generated by CopyTextureSubImage1D if
	 xoffset<0, or (xoffset+width)>w, where w is the TEXTURE_WIDTH of the
	 texture image being modified. */
	{
		gl.copyTextureSubImage1D(m_to_1D_dst, 0, -1, 0, 0, s_width);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCopyTextureSubImage1D", "xoffset<0.");

		gl.copyTextureSubImage1D(m_to_1D_dst, 0, 1, 0, 0, s_width);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCopyTextureSubImage1D",
							 "(xoffset+width)>w, where w is the TEXTURE_WIDTH of the texture image being modified.");
	}

	/* Check that INVALID_OPERATION is generated by CopyTextureSubImage1D if
	 the read buffer is NONE. */
	gl.readBuffer(GL_NONE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	{
		gl.copyTextureSubImage1D(m_to_1D_dst, 0, 0, 0, 0, s_width);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCopyTextureSubImage1D", "the read buffer is NONE.");
	}

	/* Bind multisample framebuffer. */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.readBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	/* Check that INVALID_OPERATION is generated by CopyTextureSubImage1D if
	 the effective value of SAMPLE_BUFFERS for the read
	 framebuffer is one. */
	{
		gl.copyTextureSubImage1D(m_to_1D_dst, 0, 0, 0, 0, s_width);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glCopyTextureSubImage1D",
								  "the effective value of SAMPLE_BUFFERS for the read framebuffer is one.");
	}

	return is_ok;
}